

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uts.c
# Opt level: O0

int uts_numChildren_bin(Node *parent)

{
  int n;
  double dVar1;
  int local_24;
  double d;
  int v;
  Node *parent_local;
  
  n = rng_rand((parent->state).state);
  dVar1 = rng_toProb(n);
  if (nonLeafProb <= dVar1) {
    local_24 = 0;
  }
  else {
    local_24 = nonLeafBF;
  }
  return local_24;
}

Assistant:

int uts_numChildren_bin(Node * parent) {
  // distribution is identical everywhere below root
  int    v = rng_rand(parent->state.state);	
  double d = rng_toProb(v);

  return (d < nonLeafProb) ? nonLeafBF : 0;
}